

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void P_CheckWeaponSwitch(player_t *player)

{
  ushort uVar1;
  AWeapon *pAVar2;
  int iVar3;
  undefined4 extraout_var;
  
  if (player != (player_t *)0x0) {
    uVar1 = player->WeaponState;
    if (((uVar1 & 0x10) == 0) && (player->morphTics == 0)) {
      if (player->PendingWeapon != (AWeapon *)0xffffffffffffffff) {
        if ((uVar1 & 8) == 0) {
          return;
        }
        goto P_DropWeapon;
      }
    }
    else {
      player->PendingWeapon = (AWeapon *)0xffffffffffffffff;
    }
    if (((uVar1 & 8) != 0) && (player->health < 1)) {
P_DropWeapon:
      if (player != (player_t *)0x0) {
        *(byte *)&player->WeaponState = (byte)player->WeaponState & 0xef;
        pAVar2 = player->ReadyWeapon;
        if ((pAVar2 != (AWeapon *)0x0) &&
           ((0 < player->health || (((pAVar2->super_AInventory).field_0x4de & 2) == 0)))) {
          iVar3 = (*(pAVar2->super_AInventory).super_AActor.super_DThinker.super_DObject.
                    _vptr_DObject[0x45])();
          P_SetPsprite(player,PSP_WEAPON,(FState *)CONCAT44(extraout_var,iVar3),false);
          return;
        }
      }
      return;
    }
  }
  return;
}

Assistant:

void P_CheckWeaponSwitch (player_t *player)
{
	if (player == NULL)
	{
		return;
	}
	if ((player->WeaponState & WF_DISABLESWITCH) || // Weapon changing has been disabled.
		player->morphTics != 0)					// Morphed classes cannot change weapons.
	{ // ...so throw away any pending weapon requests.
		player->PendingWeapon = WP_NOCHANGE;
	}

	// Put the weapon away if the player has a pending weapon or has died, and
	// we're at a place in the state sequence where dropping the weapon is okay.
	if ((player->PendingWeapon != WP_NOCHANGE || player->health <= 0) &&
		player->WeaponState & WF_WEAPONSWITCHOK)
	{
		P_DropWeapon(player);
	}
}